

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_16_2_fd512ddf comp,int bad_allowed,bool leftmost)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_06;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_07;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __a_09;
  anon_class_16_2_fd512ddf comp_00;
  anon_class_16_2_fd512ddf __comp;
  anon_class_16_2_fd512ddf __comp_00;
  anon_class_16_2_fd512ddf comp_01;
  anon_class_16_2_fd512ddf comp_02;
  anon_class_16_2_fd512ddf comp_03;
  anon_class_16_2_fd512ddf comp_04;
  anon_class_16_2_fd512ddf comp_05;
  anon_class_16_2_fd512ddf comp_06;
  anon_class_16_2_fd512ddf comp_07;
  anon_class_16_2_fd512ddf comp_08;
  anon_class_16_2_fd512ddf comp_09;
  anon_class_16_2_fd512ddf comp_10;
  anon_class_16_2_fd512ddf comp_11;
  bool bVar1;
  bool bVar2;
  difference_type dVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  difference_type dVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *p_Var6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  HighsInt *in_RDX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RSI;
  HighsCutGeneration *in_RDI;
  int in_R8D;
  undefined1 in_R9B;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar7;
  bool highly_unbalanced;
  diff_t r_size;
  diff_t l_size;
  bool already_partitioned;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> pivot_pos;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool>
  part_result;
  diff_t s2;
  diff_t size;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc48;
  uint7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffc58;
  byte local_391;
  HighsInt *in_stack_fffffffffffffc78;
  HighsInt in_stack_fffffffffffffc80;
  HighsInt in_stack_fffffffffffffc84;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffc98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffca0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffca8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcb0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcb8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcc0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_158 [3];
  int *local_140;
  HighsCutGeneration *local_138;
  int *local_130;
  int *local_128;
  HighsCutGeneration *local_120;
  int *local_108;
  int *local_100;
  int *local_f8;
  int *local_e0;
  int *local_d8;
  int *local_d0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_90;
  int *local_88;
  HighsCutGeneration *local_80;
  long local_78;
  HighsCutGeneration *local_58;
  HighsCutGeneration *local_38;
  undefined3 in_stack_ffffffffffffffd8;
  uint uVar8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_8;
  
  uVar8 = CONCAT13(in_R9B,in_stack_ffffffffffffffd8) & 0x1ffffff;
  local_8._M_current = (int *)in_RDI;
  do {
    while( true ) {
      dVar3 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffc48._M_current);
      if (dVar3 < 0x18) {
        if ((uVar8 & 0x1000000) == 0) {
          local_58 = (HighsCutGeneration *)local_8._M_current;
          comp_00.r._0_4_ = in_stack_fffffffffffffc80;
          comp_00.this = (HighsCutGeneration *)in_stack_fffffffffffffc78;
          comp_00.r._4_4_ = in_stack_fffffffffffffc84;
          unguarded_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                    (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,comp_00);
        }
        else {
          local_38 = (HighsCutGeneration *)local_8._M_current;
          comp_01.r = in_stack_fffffffffffffc90._M_current;
          comp_01.this = (HighsCutGeneration *)in_stack_fffffffffffffc88._M_current;
          insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                    (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,comp_01);
        }
        return;
      }
      local_78 = dVar3 / 2;
      if (dVar3 < 0x81) {
        local_130 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(in_stack_fffffffffffffc58,
                                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        local_138 = (HighsCutGeneration *)local_8._M_current;
        local_140 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator-(in_stack_fffffffffffffc58,
                                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        comp_09.r = in_stack_fffffffffffffca8._M_current;
        comp_09.this = (HighsCutGeneration *)in_stack_fffffffffffffca0._M_current;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_09);
      }
      else {
        local_80 = (HighsCutGeneration *)local_8._M_current;
        local_88 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        local_90 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        comp_05.r = in_stack_fffffffffffffca8._M_current;
        comp_05.this = (HighsCutGeneration *)in_stack_fffffffffffffca0._M_current;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_05);
        local_a8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        local_b0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        local_b8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        comp_06.r = in_stack_fffffffffffffca8._M_current;
        comp_06.this = (HighsCutGeneration *)in_stack_fffffffffffffca0._M_current;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_06);
        local_d0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        local_d8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        local_e0 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator-(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        comp_07.r = in_stack_fffffffffffffca8._M_current;
        comp_07.this = (HighsCutGeneration *)in_stack_fffffffffffffca0._M_current;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_07);
        local_f8 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(in_stack_fffffffffffffc58,
                                    CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        local_100 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(in_stack_fffffffffffffc58,
                                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        local_108 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(in_stack_fffffffffffffc58,
                                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        comp_08.r = in_stack_fffffffffffffca8._M_current;
        comp_08.this = (HighsCutGeneration *)in_stack_fffffffffffffca0._M_current;
        sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                   comp_08);
        local_120 = (HighsCutGeneration *)local_8._M_current;
        local_128 = (int *)__gnu_cxx::
                           __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(in_stack_fffffffffffffc58,
                                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        _Var4._M_current._7_1_ = in_stack_fffffffffffffc57;
        _Var4._M_current._0_7_ = in_stack_fffffffffffffc50;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (_Var4,in_stack_fffffffffffffc48);
      }
      local_391 = 0;
      if ((uVar8 & 0x1000000) == 0) {
        local_158[0] = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator-(in_stack_fffffffffffffc58,
                                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (local_158);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (&local_8);
        bVar1 = HighsCutGeneration::determineCover::anon_class_16_2_fd512ddf::operator()
                          ((anon_class_16_2_fd512ddf *)in_stack_fffffffffffffc88._M_current,
                           in_stack_fffffffffffffc84,in_stack_fffffffffffffc80);
        local_391 = bVar1 ^ 0xff;
      }
      if ((local_391 & 1) == 0) break;
      comp_02.r = in_stack_fffffffffffffc98._M_current;
      comp_02.this = (HighsCutGeneration *)in_stack_fffffffffffffc90._M_current;
      partition_left<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,comp_02);
      local_8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(in_stack_fffffffffffffc58,
                          CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    }
    comp_10.r = in_stack_fffffffffffffcb0._M_current;
    comp_10.this = (HighsCutGeneration *)in_stack_fffffffffffffca8._M_current;
    pVar7 = partition_right<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                      (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,comp_10);
    _Var4 = pVar7.first._M_current;
    dVar5 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffc48._M_current);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              (in_stack_fffffffffffffc58,
               CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    p_Var6 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             __gnu_cxx::operator-
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        in_stack_fffffffffffffc48._M_current);
    bVar1 = dVar3 / 8 <= dVar5;
    if (bVar1) {
      in_stack_fffffffffffffc58 = p_Var6;
    }
    if (bVar1 && dVar3 / 8 <= (long)p_Var6) {
      bVar1 = false;
      in_stack_fffffffffffffc78 = in_RDX;
      _Var9._M_current = in_RCX._M_current;
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        comp_03.r = in_stack_fffffffffffffc98._M_current;
        comp_03.this = (HighsCutGeneration *)in_stack_fffffffffffffc90._M_current;
        bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                          (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,comp_03);
        bVar1 = false;
        in_stack_fffffffffffffcb8._M_current = in_RDX;
        in_stack_fffffffffffffcc0._M_current = in_RCX._M_current;
        if (bVar2) {
          in_stack_fffffffffffffc98._M_current = in_stack_fffffffffffffc78;
          in_stack_fffffffffffffca0._M_current = _Var9._M_current;
          in_stack_fffffffffffffca8._M_current = in_RSI._M_current;
          in_stack_fffffffffffffcb0 =
               __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(in_stack_fffffffffffffc58,(ulong)in_stack_fffffffffffffc50);
          comp_04.r = in_stack_fffffffffffffc98._M_current;
          comp_04.this = (HighsCutGeneration *)in_stack_fffffffffffffc90._M_current;
          in_stack_fffffffffffffc78 = in_stack_fffffffffffffc98._M_current;
          _Var9._M_current = in_stack_fffffffffffffca0._M_current;
          in_RSI._M_current = in_stack_fffffffffffffca8._M_current;
          bVar1 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                            (in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,comp_04);
          in_stack_fffffffffffffcb8._M_current = in_RDX;
          in_stack_fffffffffffffcc0._M_current = in_RCX._M_current;
        }
      }
      in_RCX._M_current = _Var9._M_current;
      if (bVar1 != false) {
        return;
      }
      in_stack_fffffffffffffc57 = 0;
    }
    else {
      in_R8D = in_R8D + -1;
      if (in_R8D == 0) {
        __comp.r._0_4_ = in_stack_fffffffffffffc80;
        __comp.this = (HighsCutGeneration *)in_stack_fffffffffffffc78;
        __comp.r._4_4_ = in_stack_fffffffffffffc84;
        std::
        make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,__comp);
        __comp_00.r._0_4_ = in_stack_fffffffffffffc80;
        __comp_00.this = (HighsCutGeneration *)in_stack_fffffffffffffc78;
        __comp_00.r._4_4_ = in_stack_fffffffffffffc84;
        std::
        sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
                  (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,__comp_00);
        return;
      }
      in_stack_fffffffffffffc78 = in_RDX;
      if (0x17 < dVar5) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffc58,
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        _Var9._M_current._7_1_ = in_stack_fffffffffffffc57;
        _Var9._M_current._0_7_ = in_stack_fffffffffffffc50;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (_Var9,in_stack_fffffffffffffc48);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffc58,
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffc58,
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        __a._M_current._7_1_ = in_stack_fffffffffffffc57;
        __a._M_current._0_7_ = in_stack_fffffffffffffc50;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a,in_stack_fffffffffffffc48);
        in_stack_fffffffffffffc78 = in_RDX;
        if (0x80 < dVar5) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __a_00._M_current._7_1_ = in_stack_fffffffffffffc57;
          __a_00._M_current._0_7_ = in_stack_fffffffffffffc50;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_00,in_stack_fffffffffffffc48);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __a_01._M_current._7_1_ = in_stack_fffffffffffffc57;
          __a_01._M_current._0_7_ = in_stack_fffffffffffffc50;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_01,in_stack_fffffffffffffc48);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __a_02._M_current._7_1_ = in_stack_fffffffffffffc57;
          __a_02._M_current._0_7_ = in_stack_fffffffffffffc50;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_02,in_stack_fffffffffffffc48);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __a_03._M_current._7_1_ = in_stack_fffffffffffffc57;
          __a_03._M_current._0_7_ = in_stack_fffffffffffffc50;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_03,in_stack_fffffffffffffc48);
          in_stack_fffffffffffffc78 = in_RDX;
        }
      }
      if (0x17 < (long)p_Var6) {
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffc58,
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                  (in_stack_fffffffffffffc58,
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        __a_04._M_current._7_1_ = in_stack_fffffffffffffc57;
        __a_04._M_current._0_7_ = in_stack_fffffffffffffc50;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a_04,in_stack_fffffffffffffc48);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffc58,
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                  (in_stack_fffffffffffffc58,
                   CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
        __a_05._M_current._7_1_ = in_stack_fffffffffffffc57;
        __a_05._M_current._0_7_ = in_stack_fffffffffffffc50;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (__a_05,in_stack_fffffffffffffc48);
        if (0x80 < (long)p_Var6) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __a_06._M_current._7_1_ = in_stack_fffffffffffffc57;
          __a_06._M_current._0_7_ = in_stack_fffffffffffffc50;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_06,in_stack_fffffffffffffc48);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __a_07._M_current._7_1_ = in_stack_fffffffffffffc57;
          __a_07._M_current._0_7_ = in_stack_fffffffffffffc50;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_07,in_stack_fffffffffffffc48);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __a_08._M_current._7_1_ = in_stack_fffffffffffffc57;
          __a_08._M_current._0_7_ = in_stack_fffffffffffffc50;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_08,in_stack_fffffffffffffc48);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
                    (in_stack_fffffffffffffc58,
                     CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
          __a_09._M_current._7_1_ = in_stack_fffffffffffffc57;
          __a_09._M_current._0_7_ = in_stack_fffffffffffffc50;
          std::
          iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (__a_09,in_stack_fffffffffffffc48);
        }
      }
    }
    in_stack_fffffffffffffc80 = (HighsInt)in_RCX._M_current;
    in_stack_fffffffffffffc84 = (HighsInt)((ulong)in_RCX._M_current >> 0x20);
    comp_11.this._4_4_ = in_R8D;
    comp_11.this._0_4_ = uVar8;
    comp_11.r = in_stack_fffffffffffffc78;
    in_stack_fffffffffffffc90._M_current = local_8._M_current;
    in_RDX = in_stack_fffffffffffffc78;
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1,false>
              (in_RSI,in_RCX,comp_11,(int)((ulong)dVar3 >> 0x20),SUB81((ulong)dVar3 >> 0x18,0));
    local_8 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator+(in_stack_fffffffffffffc58,
                        CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50));
    uVar8 = uVar8 & 0xffffff;
    in_stack_fffffffffffffc88._M_current = _Var4._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }